

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGame.cpp
# Opt level: O2

void __thiscall BayesianGame::Print(BayesianGame *this)

{
  uint uVar1;
  ostream *poVar2;
  
  BayesianGameBase::Print(&this->super_BayesianGameBase);
  poVar2 = std::operator<<((ostream *)&std::cout,"Utility functions:");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (uVar1 = 0; (ulong)uVar1 < (this->super_BayesianGameBase)._m_nrAgents; uVar1 = uVar1 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Agent ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,":");
    std::endl<char,std::char_traits<char>>(poVar2);
    RewardModelDiscreteInterface::Print
              ((RewardModelDiscreteInterface *)
               ((this->_m_utilFuncs).
                super__Vector_base<RewardModelMapping,_std::allocator<RewardModelMapping>_>._M_impl.
                super__Vector_impl_data._M_start + uVar1));
  }
  return;
}

Assistant:

void BayesianGame::Print() const
{
    BayesianGameBase::Print();
    
    cout << "Utility functions:"<<endl;
    for(Index aI = 0; aI < _m_nrAgents; aI++)
    {
        cout << "Agent "<<aI<<":"<<endl;
        _m_utilFuncs[aI].Print();
    }
}